

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  ImDrawCmdHeader *pIVar1;
  ImDrawChannel *pIVar2;
  ImVector<unsigned_short> *pIVar3;
  ImDrawCmd *pIVar4;
  unsigned_short *puVar5;
  undefined8 uVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long lVar12;
  ImDrawCmd *pIVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (this->_Current == idx) {
    return;
  }
  iVar7 = (draw_list->CmdBuffer).Capacity;
  pIVar4 = (draw_list->CmdBuffer).Data;
  pIVar2 = (this->_Channels).Data + this->_Current;
  (pIVar2->_CmdBuffer).Size = (draw_list->CmdBuffer).Size;
  (pIVar2->_CmdBuffer).Capacity = iVar7;
  (pIVar2->_CmdBuffer).Data = pIVar4;
  iVar7 = (draw_list->IdxBuffer).Capacity;
  puVar5 = (draw_list->IdxBuffer).Data;
  pIVar3 = &(this->_Channels).Data[this->_Current]._IdxBuffer;
  pIVar3->Size = (draw_list->IdxBuffer).Size;
  pIVar3->Capacity = iVar7;
  pIVar3->Data = puVar5;
  this->_Current = idx;
  pIVar2 = (this->_Channels).Data + idx;
  iVar7 = (pIVar2->_CmdBuffer).Capacity;
  pIVar4 = (pIVar2->_CmdBuffer).Data;
  (draw_list->CmdBuffer).Size = (pIVar2->_CmdBuffer).Size;
  (draw_list->CmdBuffer).Capacity = iVar7;
  (draw_list->CmdBuffer).Data = pIVar4;
  pIVar3 = &(this->_Channels).Data[idx]._IdxBuffer;
  iVar7 = pIVar3->Capacity;
  puVar5 = pIVar3->Data;
  (draw_list->IdxBuffer).Size = pIVar3->Size;
  (draw_list->IdxBuffer).Capacity = iVar7;
  (draw_list->IdxBuffer).Data = puVar5;
  draw_list->_IdxWritePtr = (draw_list->IdxBuffer).Data + (draw_list->IdxBuffer).Size;
  lVar12 = (long)(draw_list->CmdBuffer).Size;
  if (lVar12 != 0) {
    pIVar4 = (draw_list->CmdBuffer).Data;
    pIVar13 = pIVar4 + lVar12 + -1;
    if (pIVar13 != (ImDrawCmd *)0x0) {
      pIVar1 = &draw_list->_CmdHeader;
      if (pIVar4[lVar12 + -1].ElemCount == 0) {
        fVar8 = (pIVar1->ClipRect).x;
        fVar9 = (pIVar1->ClipRect).y;
        fVar10 = (draw_list->_CmdHeader).ClipRect.z;
        fVar11 = (draw_list->_CmdHeader).ClipRect.w;
        uVar6 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
        *(undefined8 *)&pIVar4[lVar12 + -1].ClipRect.w =
             *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
        *(undefined8 *)((long)&pIVar4[lVar12 + -1].TextureId + 4) = uVar6;
        (pIVar13->ClipRect).x = fVar8;
        (pIVar13->ClipRect).y = fVar9;
        pIVar4[lVar12 + -1].ClipRect.z = fVar10;
        pIVar4[lVar12 + -1].ClipRect.w = fVar11;
        return;
      }
      auVar15[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar13->ClipRect).x);
      auVar15[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.x + 1));
      auVar15[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.x + 2));
      auVar15[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.x + 3));
      auVar15[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                    *(char *)&pIVar4[lVar12 + -1].ClipRect.y);
      auVar15[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.y + 1));
      auVar15[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.y + 2));
      auVar15[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.y + 3));
      auVar15[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                    *(char *)&pIVar4[lVar12 + -1].ClipRect.z);
      auVar15[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.z + 1));
      auVar15[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                     *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.z + 2));
      auVar15[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                      *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.z + 3));
      auVar15[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                      *(char *)&pIVar4[lVar12 + -1].ClipRect.w);
      auVar15[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                      *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.w + 1));
      auVar15[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                      *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.w + 2));
      auVar15[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                      *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.w + 3));
      auVar14[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar4[lVar12 + -1].ClipRect.w);
      auVar14[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.w + 1));
      auVar14[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.w + 2));
      auVar14[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].ClipRect.w + 3));
      auVar14[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                    *(char *)&pIVar4[lVar12 + -1].TextureId);
      auVar14[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].TextureId + 1));
      auVar14[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].TextureId + 2));
      auVar14[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].TextureId + 3));
      auVar14[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].TextureId + 4));
      auVar14[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                    *(char *)((long)&pIVar4[lVar12 + -1].TextureId + 5));
      auVar14[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                     *(char *)((long)&pIVar4[lVar12 + -1].TextureId + 6));
      auVar14[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                      *(char *)((long)&pIVar4[lVar12 + -1].TextureId + 7));
      auVar14[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset ==
                      (char)pIVar4[lVar12 + -1].VtxOffset);
      auVar14[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                      *(char *)((long)&pIVar4[lVar12 + -1].VtxOffset + 1));
      auVar14[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                      *(char *)((long)&pIVar4[lVar12 + -1].VtxOffset + 2));
      auVar14[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                      *(char *)((long)&pIVar4[lVar12 + -1].VtxOffset + 3));
      auVar14 = auVar14 & auVar15;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
        return;
      }
    }
  }
  ImDrawList::AddDrawCmd(draw_list);
  return;
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx)
        return;

    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = (draw_list->CmdBuffer.Size == 0) ? NULL : &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd == NULL)
        draw_list->AddDrawCmd();
    else if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();
}